

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O3

exr_result_t
extract_attr_tiledesc
          (exr_context_t ctxt,_internal_exr_seq_scratch *scratch,exr_attr_tiledesc_t *attrdata,
          char *aname,char *tname,int32_t attrsz)

{
  byte bVar1;
  exr_result_t eVar2;
  undefined8 in_RAX;
  char *pcVar3;
  ulong uVar4;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr_varargs *UNRECOVERED_JUMPTABLE;
  
  if (attrsz != 9) {
    eVar2 = (*ctxt->print_error)
                      (ctxt,0x11,"Attribute \'%s\': Invalid size %d (exp \'%s\' size %d)",aname,
                       (ulong)(uint)attrsz,tname,CONCAT44((int)((ulong)in_RAX >> 0x20),9));
    return eVar2;
  }
  eVar2 = (*scratch->sequential_read)(scratch,attrdata,9);
  if (eVar2 == 0) {
    bVar1 = attrdata->level_and_round;
    if ((bVar1 & 0xf) < 3) {
      if (bVar1 < 0x20) {
        return 0;
      }
      uVar4 = (ulong)(bVar1 >> 4);
      UNRECOVERED_JUMPTABLE = ctxt->print_error;
      pcVar3 = "Attribute \'%s\': Invalid tile rounding specification encountered: found enum %d";
    }
    else {
      UNRECOVERED_JUMPTABLE = ctxt->print_error;
      pcVar3 = "Attribute \'%s\': Invalid tile level specification encountered: found enum %d";
      uVar4 = (ulong)(bVar1 & 0xf);
    }
    eVar2 = (*UNRECOVERED_JUMPTABLE)(ctxt,0xe,pcVar3,aname,uVar4,UNRECOVERED_JUMPTABLE);
    return eVar2;
  }
  eVar2 = (*ctxt->print_error)
                    (ctxt,eVar2,"Unable to read \'%s\' %s data",aname,tname,ctxt->print_error);
  return eVar2;
}

Assistant:

static exr_result_t
extract_attr_tiledesc (
    exr_context_t                     ctxt,
    struct _internal_exr_seq_scratch* scratch,
    exr_attr_tiledesc_t*              attrdata,
    const char*                       aname,
    const char*                       tname,
    int32_t                           attrsz)
{
    exr_result_t rv;
    if (attrsz != (int32_t) sizeof (*attrdata))
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ATTR_SIZE_MISMATCH,
            "Attribute '%s': Invalid size %d (exp '%s' size %d)",
            aname,
            attrsz,
            tname,
            (int32_t) sizeof (*attrdata));

    rv = scratch->sequential_read (scratch, attrdata, sizeof (*attrdata));
    if (rv != EXR_ERR_SUCCESS)
        return ctxt->print_error (
            ctxt, rv, "Unable to read '%s' %s data", aname, tname);

    attrdata->x_size = one_to_native32 (attrdata->x_size);
    attrdata->y_size = one_to_native32 (attrdata->y_size);

    if ((int) EXR_GET_TILE_LEVEL_MODE (*attrdata) >= (int) EXR_TILE_LAST_TYPE)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ATTR,
            "Attribute '%s': Invalid tile level specification encountered: found enum %d",
            aname,
            (int) EXR_GET_TILE_LEVEL_MODE (*attrdata));

    if ((int) EXR_GET_TILE_ROUND_MODE (*attrdata) >=
        (int) EXR_TILE_ROUND_LAST_TYPE)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ATTR,
            "Attribute '%s': Invalid tile rounding specification encountered: found enum %d",
            aname,
            (int) EXR_GET_TILE_ROUND_MODE (*attrdata));

    return rv;
}